

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleDateFormat::parseInt
          (SimpleDateFormat *this,UnicodeString *text,Formattable *number,int32_t maxDigits,
          ParsePosition *pos,UBool allowNegative,NumberFormat *fmt)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  long lVar4;
  DecimalFormat *pDVar5;
  DecimalFormat *local_110;
  LocalPointerBase<icu_63::DecimalFormat> local_100;
  int local_ec;
  int local_e8;
  int32_t val;
  int32_t nDigits;
  int32_t oldPos;
  UnicodeString local_d8;
  undefined4 local_98;
  LocalPointerBase<icu_63::DecimalFormat> local_88;
  LocalPointer<icu_63::DecimalFormat> df;
  DecimalFormat *fmtAsDF;
  UnicodeString oldPrefix;
  UBool allowNegative_local;
  ParsePosition *pos_local;
  int32_t maxDigits_local;
  Formattable *number_local;
  UnicodeString *text_local;
  SimpleDateFormat *this_local;
  
  oldPrefix.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = allowNegative;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&fmtAsDF);
  if (fmt == (NumberFormat *)0x0) {
    local_100.ptr = (DecimalFormat *)0x0;
  }
  else {
    local_100.ptr =
         (DecimalFormat *)__dynamic_cast(fmt,&NumberFormat::typeinfo,&DecimalFormat::typeinfo,0);
  }
  df.super_LocalPointerBase<icu_63::DecimalFormat>.ptr =
       (LocalPointerBase<icu_63::DecimalFormat>)
       (LocalPointerBase<icu_63::DecimalFormat>)local_100.ptr;
  LocalPointer<icu_63::DecimalFormat>::LocalPointer
            ((LocalPointer<icu_63::DecimalFormat> *)&local_88,(DecimalFormat *)0x0);
  if ((oldPrefix.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') &&
     (df.super_LocalPointerBase<icu_63::DecimalFormat>.ptr != (DecimalFormat *)0x0)) {
    lVar4 = (**(code **)(*(long *)df.super_LocalPointerBase<icu_63::DecimalFormat>.ptr + 0x20))();
    if (lVar4 == 0) {
      local_110 = (DecimalFormat *)0x0;
    }
    else {
      local_110 = (DecimalFormat *)
                  __dynamic_cast(lVar4,&Format::typeinfo,&DecimalFormat::typeinfo,0);
    }
    LocalPointer<icu_63::DecimalFormat>::adoptInstead
              ((LocalPointer<icu_63::DecimalFormat> *)&local_88,local_110);
    UVar1 = LocalPointerBase<icu_63::DecimalFormat>::isNull(&local_88);
    if (UVar1 != '\0') {
      local_98 = 1;
      goto LAB_00371556;
    }
    pDVar5 = LocalPointerBase<icu_63::DecimalFormat>::operator->(&local_88);
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&nDigits,L"꬀");
    icu_63::UnicodeString::UnicodeString(&local_d8,'\x01',(ConstChar16Ptr *)&nDigits,-1);
    (*(pDVar5->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x2e])(pDVar5,&local_d8)
    ;
    icu_63::UnicodeString::~UnicodeString(&local_d8);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&nDigits);
    fmt = &LocalPointerBase<icu_63::DecimalFormat>::getAlias(&local_88)->super_NumberFormat;
  }
  iVar2 = ParsePosition::getIndex(pos);
  (*(fmt->super_Format).super_UObject._vptr_UObject[0x14])(fmt,text,number,pos);
  if (0 < maxDigits) {
    iVar3 = ParsePosition::getIndex(pos);
    if (maxDigits < iVar3 - iVar2) {
      local_ec = Formattable::getLong(number);
      for (local_e8 = (iVar3 - iVar2) - maxDigits; 0 < local_e8; local_e8 = local_e8 + -1) {
        local_ec = local_ec / 10;
      }
      ParsePosition::setIndex(pos,iVar2 + maxDigits);
      Formattable::setLong(number,local_ec);
    }
  }
  local_98 = 0;
LAB_00371556:
  LocalPointer<icu_63::DecimalFormat>::~LocalPointer
            ((LocalPointer<icu_63::DecimalFormat> *)&local_88);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&fmtAsDF);
  return;
}

Assistant:

void SimpleDateFormat::parseInt(const UnicodeString& text,
                                Formattable& number,
                                int32_t maxDigits,
                                ParsePosition& pos,
                                UBool allowNegative,
                                const NumberFormat *fmt) const {
    UnicodeString oldPrefix;
    auto* fmtAsDF = dynamic_cast<const DecimalFormat*>(fmt);
    LocalPointer<DecimalFormat> df;
    if (!allowNegative && fmtAsDF != nullptr) {
        df.adoptInstead(dynamic_cast<DecimalFormat*>(fmtAsDF->clone()));
        if (df.isNull()) {
            // Memory allocation error
            return;
        }
        df->setNegativePrefix(UnicodeString(TRUE, SUPPRESS_NEGATIVE_PREFIX, -1));
        fmt = df.getAlias();
    }
    int32_t oldPos = pos.getIndex();
    fmt->parse(text, number, pos);

    if (maxDigits > 0) {
        // adjust the result to fit into
        // the maxDigits and move the position back
        int32_t nDigits = pos.getIndex() - oldPos;
        if (nDigits > maxDigits) {
            int32_t val = number.getLong();
            nDigits -= maxDigits;
            while (nDigits > 0) {
                val /= 10;
                nDigits--;
            }
            pos.setIndex(oldPos + maxDigits);
            number.setLong(val);
        }
    }
}